

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void * __thiscall
google::protobuf::FileDescriptorTables::FindParentForFieldsByMap
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  
  if ((field->field_0x1 & 8) == 0) {
    pFVar2 = (FileDescriptor *)field->containing_type_;
  }
  else {
    pDVar1 = FieldDescriptor::extension_scope(field);
    if (pDVar1 != (Descriptor *)0x0) {
      pDVar1 = FieldDescriptor::extension_scope(field);
      return pDVar1;
    }
    pFVar2 = field->file_;
  }
  return pFVar2;
}

Assistant:

const void* FileDescriptorTables::FindParentForFieldsByMap(
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return field->file();
    } else {
      return field->extension_scope();
    }
  } else {
    return field->containing_type();
  }
}